

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O2

void amrex::BLBackTrace::print_backtrace_info(string *filename)

{
  ostringstream *poVar1;
  FILE *__stream;
  ostream *os_;
  Print PStack_198;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"w");
  if (__stream != (FILE *)0x0) {
    print_backtrace_info((FILE *)__stream);
    fclose(__stream);
    return;
  }
  os_ = OutStream();
  Print::Print(&PStack_198,os_);
  poVar1 = &PStack_198.ss;
  std::operator<<((ostream *)poVar1,"Warning @ BLBackTrace::print_backtrace_info: ");
  std::operator<<((ostream *)poVar1,(string *)filename);
  std::operator<<((ostream *)poVar1," is not a valid output file.");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  Print::~Print(&PStack_198);
  return;
}

Assistant:

void
BLBackTrace::print_backtrace_info (const std::string& filename)
{
    if (FILE* p = fopen(filename.c_str(), "w"))
    {
      BLBackTrace::print_backtrace_info(p);
      fclose(p);
    }
    else
    {
        amrex::Print() << "Warning @ BLBackTrace::print_backtrace_info: "
                       << filename << " is not a valid output file."
                       << std::endl;
    }
}